

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inter_basics.cpp
# Opt level: O1

void change_priority_level(Am_Object *inter,bool from_running,bool to_running)

{
  Am_Value *this;
  undefined7 in_register_00000011;
  undefined7 in_register_00000031;
  float value;
  
  this = Am_Object::Get(inter,0xcd,0);
  value = Am_Value::operator_cast_to_float(this);
  if ((int)CONCAT71(in_register_00000031,from_running) != 0) {
    value = value + -100.0;
  }
  if ((int)CONCAT71(in_register_00000011,to_running) != 0) {
    value = value + 100.0;
  }
  Am_Object::Set(inter,0xcd,value,0);
  return;
}

Assistant:

static void
change_priority_level(Am_Object &inter, bool from_running, bool to_running)
{
  float current_priority = inter.Get(Am_PRIORITY);
  if (from_running)
    current_priority = current_priority - Am_INTER_PRIORITY_DIFF;
  if (to_running)
    current_priority = current_priority + Am_INTER_PRIORITY_DIFF;
  inter.Set(Am_PRIORITY, current_priority);
  // Setting the priority should invoke the formula above:
  // maintain_inter_to_window_list_priority, which will adjust the interactor
  // in the window's inter_list.
}